

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O0

Constraint * create_equal_to_hexvalue_constraint(intptr_t expected_value,char *expected_value_name)

{
  CgreenValue expected_value_00;
  Constraint *pCVar1;
  intptr_t in_RDI;
  Constraint *constraint;
  undefined8 in_stack_ffffffffffffffd0;
  anon_union_8_4_d526cc82_for_value in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  make_cgreen_integer_value((CgreenValue *)&stack0xffffffffffffffd0,in_RDI);
  expected_value_00.value.integer_value = in_stack_ffffffffffffffd8.integer_value;
  expected_value_00.type = (CgreenValueType)in_stack_ffffffffffffffd0;
  expected_value_00._4_4_ = SUB84(in_stack_ffffffffffffffd0,4);
  expected_value_00.value_size = in_stack_ffffffffffffffe0;
  pCVar1 = create_constraint_expecting(expected_value_00,in_stack_ffffffffffffffd8.string_value);
  pCVar1->type = CGREEN_VALUE_COMPARER_CONSTRAINT;
  pCVar1->compare = compare_want_value;
  pCVar1->execute = test_want;
  pCVar1->name = "equal";
  pCVar1->size_of_expected_value = 8;
  pCVar1->actual_value_message = "\n\t\tactual value:\t\t\t[0x%x]";
  pCVar1->expected_value_message = "\t\texpected value:\t\t\t[0x%x]";
  return pCVar1;
}

Assistant:

Constraint *create_equal_to_hexvalue_constraint(intptr_t expected_value, const char *expected_value_name) {
    Constraint *constraint = create_constraint_expecting(make_cgreen_integer_value(expected_value), expected_value_name);
    constraint->type = CGREEN_VALUE_COMPARER_CONSTRAINT;

    constraint->compare = &compare_want_value;
    constraint->execute = &test_want;
    constraint->name = "equal";
    constraint->size_of_expected_value = sizeof(intptr_t);
    constraint->actual_value_message = "\n\t\tactual value:\t\t\t[0x%x]";
    constraint->expected_value_message = "\t\texpected value:\t\t\t[0x%x]";

    return constraint;
}